

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O0

void __thiscall L13_2::BankAccountPlus::view(BankAccountPlus *this)

{
  format f;
  streamsize p;
  ostream *poVar1;
  void *pvVar2;
  precis initPrec;
  format initState;
  BankAccountPlus *this_local;
  
  f = set_format();
  p = std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  BankAccount::view(&this->super_BankAccount);
  poVar1 = std::operator<<((ostream *)&std::cout,"[BankAccountPlus] Maximum loan: $");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->_max_loan);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"[BankAccountPlus] Current loan: $");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->_loan);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3);
  poVar1 = std::operator<<((ostream *)&std::cout,"[BankAccountPlus] Rate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_rate * 100.0);
  std::operator<<(poVar1,"%\n");
  reset_format(f,p);
  return;
}

Assistant:

void BankAccountPlus::view() const {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  Todo:
        BankAccount::view();
        cout << "[BankAccountPlus] Maximum loan: $" << _max_loan << endl;
        cout << "[BankAccountPlus] Current loan: $" << _loan << endl;
        cout.precision(3); // ###.###
        cout << "[BankAccountPlus] Rate: " << 100 * _rate << "%\n";

        reset_format(initState, initPrec);
    }